

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RequiresChainedFlags_Test::TestBody(TApp_RequiresChainedFlags_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  bool bVar1;
  Option *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4a8;
  allocator local_41b;
  allocator local_41a;
  allocator local_419;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string local_3f0 [32];
  string local_3d0 [32];
  iterator local_3b0;
  size_type local_3a8;
  undefined1 local_39b;
  allocator local_39a;
  allocator local_399 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_370 [32];
  iterator local_350;
  size_type local_348;
  AssertHelper local_340;
  Message local_338 [2];
  RequiresError *anon_var_0_3;
  char *pcStack_320;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8 [32];
  iterator local_2c8;
  size_type local_2c0;
  AssertHelper local_2b8;
  Message local_2b0 [2];
  RequiresError *anon_var_0_2;
  char *pcStack_298;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260 [32];
  iterator local_240;
  size_type local_238;
  AssertHelper local_230;
  Message local_228 [2];
  RequiresError *anon_var_0_1;
  char *pcStack_210;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  iterator local_1d8;
  size_type local_1d0;
  AssertHelper local_1c8;
  Message local_1c0 [2];
  RequiresError *anon_var_0;
  char *pcStack_1a8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  iterator local_170;
  size_type local_168;
  undefined1 local_15a;
  allocator local_159 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  iterator local_130;
  size_type local_128;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  Option *local_80;
  Option *opt2;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *opt1;
  TApp_RequiresChainedFlags_Test *this_local;
  
  opt1 = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--opt1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&opt2 + 7));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&opt2 + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"--opt2",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_a0,&local_c8);
  pOVar2 = CLI::Option::requires(pOVar2,local_18);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"--opt3",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"",&local_119);
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_f0,&local_118);
  CLI::Option::requires(pOVar2,local_80);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_15a = '\x01';
  local_159._1_8_ = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"--opt1",local_159);
  local_15a = '\0';
  local_130 = &local_150;
  local_128 = 1;
  __l_05._M_len = 1;
  __l_05._M_array = local_130;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_05);
  local_4a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
  do {
    local_4a8 = local_4a8 + -1;
    std::__cxx11::string::~string((string *)local_4a8);
  } while (local_4a8 != &local_150);
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,"--opt2",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_170 = &local_190;
  local_168 = 1;
  __l_04._M_len = 1;
  __l_04._M_array = local_170;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_04);
  local_4d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
  do {
    local_4d0 = local_4d0 + -1;
    std::__cxx11::string::~string((string *)local_4d0);
  } while (local_4d0 != &local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe58);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_1a8 = 
      "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
      ;
      goto LAB_0014a854;
    }
  }
  else {
LAB_0014a854:
    testing::Message::Message(local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x46b,pcStack_1a8);
    testing::internal::AssertHelper::operator=(&local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    testing::Message::~Message(local_1c0);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f8,"--opt3",(allocator *)((long)&gtest_msg_1.value + 7));
  gtest_msg_1.value._6_1_ = 0;
  local_1d8 = &local_1f8;
  local_1d0 = 1;
  __l_03._M_len = 1;
  __l_03._M_array = local_1d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_03);
  local_550 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8;
  do {
    local_550 = local_550 + -1;
    std::__cxx11::string::~string((string *)local_550);
  } while (local_550 != &local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdf0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdf0);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) == 0) {
      pcStack_210 = 
      "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
      ;
      goto LAB_0014ab8b;
    }
  }
  else {
LAB_0014ab8b:
    testing::Message::Message(local_228);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x46f,pcStack_210);
    testing::internal::AssertHelper::operator=(&local_230,local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message(local_228);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_2.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_280,"--opt3",(allocator *)((long)&gtest_msg_2.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"--opt2",(allocator *)((long)&gtest_msg_2.value + 6));
  gtest_msg_2.value._5_1_ = 0;
  local_240 = &local_280;
  local_238 = 2;
  __l_02._M_len = 2;
  __l_02._M_array = local_240;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_5b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_240;
  do {
    local_5b8 = local_5b8 + -1;
    std::__cxx11::string::~string((string *)local_5b8);
  } while (local_5b8 != &local_280);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_2.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffd68,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffd68);
  if (bVar1) {
    anon_var_0_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_2._7_1_ & 1) == 0) {
      pcStack_298 = 
      "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing."
      ;
      goto LAB_0014af2c;
    }
  }
  else {
LAB_0014af2c:
    testing::Message::Message(local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x473,pcStack_298);
    testing::internal::AssertHelper::operator=(&local_2b8,local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(local_2b0);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_3.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_308,"--opt3",(allocator *)((long)&gtest_msg_3.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"--opt1",(allocator *)((long)&gtest_msg_3.value + 6));
  gtest_msg_3.value._5_1_ = 0;
  local_2c8 = &local_308;
  local_2c0 = 2;
  __l_01._M_len = 2;
  __l_01._M_array = local_2c8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_620 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8;
  do {
    local_620 = local_620 + -1;
    std::__cxx11::string::~string((string *)local_620);
  } while (local_620 != &local_308);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_3.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_3.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffce0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffce0);
  if (bVar1) {
    anon_var_0_3._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_3._7_1_ & 1) != 0) goto LAB_0014b365;
    pcStack_320 = 
    "Expected: run() throws an exception of type CLI::RequiresError.\n  Actual: it throws nothing.";
  }
  testing::Message::Message(local_338);
  testing::internal::AssertHelper::AssertHelper
            (&local_340,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x477,pcStack_320);
  testing::internal::AssertHelper::operator=(&local_340,local_338);
  testing::internal::AssertHelper::~AssertHelper(&local_340);
  testing::Message::~Message(local_338);
LAB_0014b365:
  CLI::App::reset(&(this->super_TApp).app);
  local_39b = '\x01';
  local_399._1_8_ = &local_390;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"--opt2",local_399);
  local_399._1_8_ = local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"--opt1",&local_39a);
  local_39b = '\0';
  local_350 = &local_390;
  local_348 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_350;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_688 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_350;
  do {
    local_688 = local_688 + -1;
    std::__cxx11::string::~string((string *)local_688);
  } while (local_688 != &local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_39a);
  std::allocator<char>::~allocator((allocator<char> *)local_399);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_418 = &local_410;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"--opt1",&local_419);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"--opt2",&local_41a);
  local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"--opt3",&local_41b);
  local_3b0 = &local_410;
  local_3a8 = 3;
  __l._M_len = 3;
  __l._M_array = local_3b0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_6d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0;
  do {
    local_6d0 = local_6d0 + -1;
    std::__cxx11::string::~string((string *)local_6d0);
  } while (local_6d0 != &local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_41b);
  std::allocator<char>::~allocator((allocator<char> *)&local_41a);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RequiresChainedFlags) {
    CLI::Option *opt1 = app.add_flag("--opt1");
    CLI::Option *opt2 = app.add_flag("--opt2")->requires(opt1);
    app.add_flag("--opt3")->requires(opt2);

    run();

    app.reset();
    args = {"--opt1"};
    run();

    app.reset();
    args = {"--opt2"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3", "--opt2"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt3", "--opt1"};
    EXPECT_THROW(run(), CLI::RequiresError);

    app.reset();
    args = {"--opt2", "--opt1"};
    run();

    app.reset();
    args = {"--opt1", "--opt2", "--opt3"};
    run();
}